

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

__pid_t __thiscall
kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>::wait
          (Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_> *this,
          void *__stat_loc)

{
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *exception;
  WaitScope *in_RDX;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_> result;
  ExceptionOrValue local_1b8;
  char local_58;
  Disposer *local_50;
  PromiseNode *pPStack_48;
  Disposer *local_40;
  PromiseNode *pPStack_38;
  Disposer *local_30;
  PromiseNode *pPStack_28;
  Disposer *local_20;
  PromiseNode *pPStack_18;
  
  local_1b8.exception.ptr.isSet = false;
  local_58 = '\0';
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)__stat_loc,&local_1b8,in_RDX);
  if (local_58 == '\x01') {
    exception = &local_1b8.exception.ptr.field_1;
    if (local_1b8.exception.ptr.isSet != false) {
      throwRecoverableException(&exception->value,0);
    }
    this[2].super_PromiseBase.node.disposer = local_30;
    this[2].super_PromiseBase.node.ptr = pPStack_28;
    this[1].super_PromiseBase.node.disposer = local_40;
    this[1].super_PromiseBase.node.ptr = pPStack_38;
    (this->super_PromiseBase).node.disposer = local_50;
    (this->super_PromiseBase).node.ptr = pPStack_48;
    this[3].super_PromiseBase.node.disposer = local_20;
    this[3].super_PromiseBase.node.ptr = pPStack_18;
    pPStack_18 = (PromiseNode *)0x0;
    if (local_1b8.exception.ptr.isSet == true) {
      Exception::~Exception(&exception->value);
    }
    return (__pid_t)this;
  }
  if (local_1b8.exception.ptr.isSet != false) {
    throwFatalException(&local_1b8.exception.ptr.field_1.value,0);
  }
  kj::_::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }